

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::setBaseSize(QWidget *this,int basew,int baseh)

{
  QWidgetPrivate *this_00;
  QTLWExtra *pQVar1;
  
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  QWidgetPrivate::createTLExtra(this_00);
  pQVar1 = QWidgetPrivate::topData(this_00);
  if ((pQVar1->basew != basew) || (pQVar1->baseh != baseh)) {
    pQVar1->basew = (short)basew;
    pQVar1->baseh = (short)baseh;
    if (((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
      QWidgetPrivate::setConstraints_sys(this_00);
      return;
    }
  }
  return;
}

Assistant:

void QWidget::setBaseSize(int basew, int baseh)
{
    Q_D(QWidget);
    d->createTLExtra();
    QTLWExtra* x = d->topData();
    if (x->basew == basew && x->baseh == baseh)
        return;
    x->basew = basew;
    x->baseh = baseh;
    if (isWindow())
        d->setConstraints_sys();
}